

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

string * stackjit::Runtime::getExecutableDir_abi_cxx11_(void)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  string *in_RDI;
  allocator local_245;
  int local_244;
  int local_240;
  int local_23c;
  char local_238 [4];
  int bytes;
  char temp [32];
  char buffer [512];
  int bufferSize;
  
  uVar1 = getpid();
  sprintf(local_238,"/proc/%d/exe",(ulong)uVar1);
  sVar2 = readlink(local_238,temp + 0x18,0x200);
  local_240 = (int)sVar2;
  local_244 = 0x1ff;
  piVar3 = std::min<int>(&local_240,&local_244);
  local_23c = *piVar3;
  if (-1 < local_23c) {
    temp[(long)local_23c + 0x18] = '\0';
  }
  temp[(long)(local_23c + -8) + 0x18] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,temp + 0x18,&local_245);
  std::allocator<char>::~allocator((allocator<char> *)&local_245);
  return in_RDI;
}

Assistant:

std::string getExecutableDir() {
			const int bufferSize = 512;
			char buffer[bufferSize];
			char temp[32];
			sprintf(temp, "/proc/%d/exe", getpid());
			int bytes = std::min((int)readlink(temp, buffer, bufferSize), bufferSize - 1);

			if (bytes >= 0) {
				buffer[bytes] = '\0';
			}

			//Remove the name
			buffer[bytes - 8] = '\0';
			return std::string(buffer);
		}